

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBucket::VerifyMark(LargeHeapBucket *this)

{
  LargeHeapBucket *this_local;
  
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::VerifyMark()::__0>
            (this->largeBlockList);
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::VerifyMark()::__1>
            (this->fullLargeBlockList);
  HeapBlockList::ForEach<Memory::LargeHeapBlock,Memory::LargeHeapBucket::VerifyMark()::__2>
            (this->pendingDisposeLargeBlockList);
  return;
}

Assistant:

void
LargeHeapBucket::VerifyMark()
{
    HeapBlockList::ForEach(largeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(fullLargeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [](LargeHeapBlock * largeHeapBlock)
    {
        largeHeapBlock->VerifyMark();
    });
}